

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzconnect.cpp
# Opt level: O3

int __thiscall TPZConnect::CheckDependency(TPZConnect *this,int nshape,TPZCompMesh *mesh,int nstate)

{
  long lVar1;
  int iVar2;
  TPZConnect *this_00;
  long lVar3;
  ostream *poVar4;
  char *pcVar5;
  TPZDepend *first;
  TPZDepend *pTVar6;
  
  pTVar6 = this->fDependList;
  if (pTVar6 != (TPZDepend *)0x0) {
    do {
      if ((pTVar6->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
          fRow != (long)nshape) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "TPZConnect::CheckDependency inconsistent dependency nshape = ",0x3d);
        pcVar5 = " nrows ";
LAB_0119f288:
        poVar4 = (ostream *)std::ostream::operator<<(&std::cout,nshape);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,7);
        poVar4 = std::ostream::_M_insert<long>((long)poVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        return -1;
      }
      lVar1 = (pTVar6->fDepMatrix).super_TPZFMatrix<double>.super_TPZMatrix<double>.
              super_TPZBaseMatrix.fCol;
      this_00 = TPZChunkVector<TPZConnect,_10>::operator[]
                          (&(mesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,
                           pTVar6->fDepConnectIndex);
      if (this_00->fSequenceNumber < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"TPZConnect::NDof. Connect is inactive.\n",0x27);
        lVar3 = -1;
      }
      else {
        lVar3 = (long)(mesh->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                      [(int)this_00->fSequenceNumber].dim;
      }
      if (lVar1 * nstate - lVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "TPZConnect::CheckDependency inconsistent dependency ndof = ",0x3b);
        if (this_00->fSequenceNumber < 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"TPZConnect::NDof. Connect is inactive.\n",0x27);
          pcVar5 = " ncols ";
          nshape = -1;
        }
        else {
          nshape = (mesh->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                   [(int)this_00->fSequenceNumber].dim;
          pcVar5 = " ncols ";
        }
        goto LAB_0119f288;
      }
      if (this_00->fDependList != (TPZDepend *)0x0) {
        if (this_00->fSequenceNumber < 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"TPZConnect::NDof. Connect is inactive.\n",0x27);
          iVar2 = -1;
        }
        else {
          iVar2 = (mesh->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore
                  [(int)this_00->fSequenceNumber].dim;
        }
        iVar2 = CheckDependency(this_00,iVar2 / nstate,mesh,nstate);
        if (iVar2 == -1) {
          return -1;
        }
      }
      pTVar6 = pTVar6->fNext;
    } while (pTVar6 != (TPZDepend *)0x0);
  }
  return 0;
}

Assistant:

TPZConnect::TPZDepend::~TPZDepend() {
	if(fNext) delete fNext;
}